

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  undefined8 uVar1;
  ITransientExpression *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string *in_RDX;
  undefined8 *in_RSI;
  AssertionResultData *in_RDI;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionInfo *info_00;
  RunContext *this_00;
  RunContext *in_stack_fffffffffffffee0;
  undefined1 local_88 [80];
  AssertionResult *in_stack_ffffffffffffffc8;
  RunContext *in_stack_ffffffffffffffd0;
  
  *(undefined4 *)&in_RDI[4].message.field_2 = *(undefined4 *)(in_RSI + 6);
  uVar1 = *in_RSI;
  pIVar2 = (ITransientExpression *)in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[5];
  *(ITransientExpression **)&in_RDI[4].message = (ITransientExpression *)in_RSI[4];
  in_RDI[4].message._M_string_length = uVar5;
  *(undefined8 *)&in_RDI[3].lazyExpression.m_isNegated = uVar3;
  *(undefined8 *)&in_RDI[3].resultType = uVar4;
  *(undefined8 *)((long)&in_RDI[3].reconstructedExpression.field_2 + 8) = uVar1;
  in_RDI[3].lazyExpression.m_transientExpression = pIVar2;
  info_00 = (AssertionInfo *)local_88;
  LazyExpression::LazyExpression((LazyExpression *)info_00,false);
  this_00 = (RunContext *)(local_88 + 0x10);
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)this_00,(OfType)((ulong)info_00 >> 0x20),
             (LazyExpression *)in_RDI);
  std::__cxx11::string::operator=((string *)this_00,in_RDX);
  AssertionResult::AssertionResult((AssertionResult *)this_00,info_00,in_RDI);
  assertionEnded(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  populateReaction(this_00,(AssertionReaction *)info_00);
  resetAssertionInfo(in_stack_fffffffffffffee0);
  AssertionResult::~AssertionResult((AssertionResult *)0x1914d9);
  AssertionResultData::~AssertionResultData(in_RDI);
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
            AssertionInfo const& info,
            std::string&& message,
            AssertionReaction& reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( ResultWas::ThrewException, LazyExpression( false ) );
        data.message = CATCH_MOVE(message);
        AssertionResult assertionResult{ info, CATCH_MOVE(data) };
        assertionEnded( CATCH_MOVE(assertionResult) );
        populateReaction( reaction );
        resetAssertionInfo();
    }